

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O0

bool __thiscall RecursiveInotifyPoller::AddWatch(RecursiveInotifyPoller *this,string *path)

{
  uint uVar1;
  int iVar2;
  char *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  dirent *local_30;
  dirent *de;
  DIR *d;
  string *path_local;
  RecursiveInotifyPoller *this_local;
  
  d = (DIR *)path;
  path_local = (string *)this;
  uVar1 = (*this->ip_->_vptr_InotifyPoller[2])(this->ip_,path);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    __name = (char *)std::__cxx11::string::c_str();
    de = (dirent *)opendir(__name);
    if (de != (dirent *)0x0) {
      while (local_30 = readdir((DIR *)de), local_30 != (dirent *)0x0) {
        if (((local_30->d_type == '\x04') && (iVar2 = strcmp(local_30->d_name,"."), iVar2 != 0)) &&
           (iVar2 = strcmp(local_30->d_name,".."), iVar2 != 0)) {
          std::operator+(&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d,
                         local_30->d_name);
          std::operator+(&local_50,&local_70,'/');
          (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      closedir((DIR *)de);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Add the path itself.
  if (!ip_->AddWatch(path))
    return false;

  // Recursive add all of its children.
  DIR* d = opendir(path.c_str());
  if (d != nullptr) {
    struct dirent* de;
    while ((de = readdir(d)) != nullptr) {
      if (de->d_type == DT_DIR && strcmp(de->d_name, ".") != 0 &&
          strcmp(de->d_name, "..") != 0)
        AddWatch(path + de->d_name + '/');
    }
    closedir(d);
  }
  return true;
}